

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::CommonCore(CommonCore *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_Core)._vptr_Core = (_func_int **)&PTR__Core_004c7508;
  BrokerBase::BrokerBase(&this->super_BrokerBase,false);
  (this->super_Core)._vptr_Core = (_func_int **)&PTR__CommonCore_004c6f70;
  (this->super_BrokerBase)._vptr_BrokerBase = (_func_int **)&DAT_004c7300;
  (this->simTime).super___atomic_float<double>._M_fp = -98763.2;
  (this->keyFed).gid = -2010000000;
  (this->prevIdentifier)._M_dataplus._M_p = (pointer)&(this->prevIdentifier).field_2;
  (this->prevIdentifier)._M_string_length = 0;
  (this->prevIdentifier).field_2._M_local_buf[0] = '\0';
  (this->routing_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->routing_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->routing_table)._M_t._M_impl.super__Rb_tree_header;
  (this->routing_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->routing_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  memset(&(this->routing_table)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0x88);
  (this->delayTransmitQueue).queueEmptyFlag._M_base._M_i = true;
  (this->knownExternalEndpoints)._M_h._M_buckets =
       &(this->knownExternalEndpoints)._M_h._M_single_bucket;
  (this->knownExternalEndpoints)._M_h._M_bucket_count = 1;
  (this->knownExternalEndpoints)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->knownExternalEndpoints)._M_h._M_element_count = 0;
  (this->knownExternalEndpoints)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->knownExternalEndpoints)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->knownExternalEndpoints)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->tags).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tags).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tags).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::make_unique<helics::TimeoutMonitor>();
  this->mGlobalFederationSize = 0;
  (this->delayInitCounter).super___atomic_base<short>._M_i = 0;
  this->filterTiming = false;
  (this->federates).m_obj.dataStorage.
  super__Vector_base<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>,_std::allocator<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->federates).m_obj.lookup._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->federates).m_obj.lookup._M_h._M_bucket_count = 0;
  (this->federates).m_obj.lookup._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->federates).m_obj.lookup._M_h._M_element_count = 0;
  *(undefined8 *)&(this->federates).m_obj.lookup._M_h._M_rehash_policy = 0;
  (this->federates).m_obj.dataStorage.
  super__Vector_base<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>,_std::allocator<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->federates).m_obj.dataStorage.
  super__Vector_base<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>,_std::allocator<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->federates).m_obj.lookup._M_h._M_buckets =
       &(this->federates).m_obj.lookup._M_h._M_single_bucket;
  (this->federates).m_obj.lookup._M_h._M_bucket_count = 1;
  (this->federates).m_obj.lookup._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->federates).m_obj.lookup._M_h._M_element_count = 0;
  (this->federates).m_obj.lookup._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->federates).m_obj.lookup._M_h._M_rehash_policy._M_next_resize = 0;
  (this->federates).m_obj.lookup._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->federates).m_mutex._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->federates).m_mutex._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->federates).m_mutex._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->federates).m_mutex._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->federates).m_mutex._M_impl._M_rwlock + 0x20) = 0;
  (this->federates).m_mutex._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->federates).m_mutex._M_impl._M_rwlock + 0x30) = 0;
  gmlc::containers::
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::
  DualStringMappedVector(&this->loopFederates);
  (this->messageCounter).super___atomic_base<int>._M_i = 0x36;
  gmlc::libguarded::ordered_guarded<helics::HandleManager,_std::shared_mutex>::ordered_guarded<>
            (&this->handles);
  HandleManager::HandleManager(&this->loopHandles);
  (this->timeBlocks).
  super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->translatorFed = (TranslatorFederate *)0x0;
  (this->timeBlocks).
  super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->timeBlocks).
  super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->translatorThread)._M_i._M_thread = 0;
  (this->translatorFedID)._M_i.gid = -2010000000;
  p_Var1 = &(this->delayedTimingMessages)._M_t._M_impl.super__Rb_tree_header;
  (this->delayedTimingMessages)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->delayedTimingMessages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->delayedTimingMessages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->delayedTimingMessages)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->delayedTimingMessages)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->queryCounter).super___atomic_base<int>._M_i = 1;
  gmlc::concurrency::
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  DelayedObjects(&this->activeQueries);
  std::
  _Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ::_Deque_base(&(this->queryTimeouts).
                 super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
               );
  (this->mapBuilders).
  super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->filterFed = (FilterFederate *)0x0;
  (this->mapBuilders).
  super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mapBuilders).
  super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filterThread)._M_i._M_thread = 0;
  (this->filterFedID)._M_i.gid = -2010000000;
  (this->nextAirLock).super___atomic_base<unsigned_short>._M_i = 0;
  std::array<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>,_4UL>::array
            (&this->dataAirlocks);
  gmlc::concurrency::TriggerVariable::TriggerVariable(&this->disconnection,false);
  (this->initIterations)._M_base._M_i = false;
  return;
}

Assistant:

CommonCore::CommonCore() noexcept: timeoutMon(std::make_unique<TimeoutMonitor>()) {}